

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inequation.cpp
# Opt level: O0

void __thiscall inequation_False_Test::TestBody(inequation_False_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr *ex;
  AssertHelper local_90;
  Message local_88;
  string local_80;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  ExprPtr local_40;
  ExprPtr local_30;
  undefined1 local_20 [8];
  ExprPtr e;
  inequation_False_Test *this_local;
  
  e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  mathiu::impl::operator____i((impl *)&local_30,2);
  mathiu::impl::operator____i((impl *)&local_40,3);
  mathiu::impl::operator>((impl *)local_20,&local_30,&local_40);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_40);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_30);
  mathiu::impl::toString_abi_cxx11_(&local_80,(impl *)local_20,ex);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_60,"toString(e)","\"false\"",&local_80,(char (*) [6])"false");
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/inequation.cpp"
               ,0xf,message);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_20);
  return;
}

Assistant:

TEST(inequation, False)
{
    auto const e = 2_i > 3_i;
    EXPECT_EQ(toString(e), "false");
}